

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void deqp::gls::LifetimeTests::details::addTestCases(TestCaseGroup *group,Types *types)

{
  LifeTestSpec *spec;
  LifeTestSpec *testCtx_00;
  Types *this;
  bool bVar1;
  vector<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
  *types_00;
  TestNode *pTVar2;
  LifeTest *this_00;
  Type *type;
  TestNode *pTVar3;
  reference ppAVar4;
  AttachmentTest *this_01;
  reference ppIVar5;
  InputAttachmentTest *this_02;
  reference ppOVar6;
  Attacher *pAVar7;
  OutputAttachmentTest *this_03;
  char *pcVar8;
  char *pcVar9;
  Attacher *attacher;
  Attacher *attacher_00;
  Attacher *attacher_01;
  undefined1 local_138 [8];
  string name_2;
  __normal_iterator<deqp::gls::LifetimeTests::details::OutputAttacher_*const_*,_std::vector<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>_>
  local_110;
  const_iterator it_3;
  vector<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>
  *outAtts;
  TestCaseGroup *outputGroup;
  string name_1;
  __normal_iterator<deqp::gls::LifetimeTests::details::InputAttacher_*const_*,_std::vector<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>_>
  local_d0;
  const_iterator it_2;
  vector<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
  *inAtts;
  TestCaseGroup *inputGroup;
  undefined1 local_a8 [8];
  string name;
  __normal_iterator<deqp::gls::LifetimeTests::details::Attacher_*const_*,_std::vector<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>_>
  local_80;
  const_iterator it_1;
  vector<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
  *atts;
  TestCaseGroup *nameGroup;
  TestCaseGroup *attGroup;
  TestCaseGroup *delUsedGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> local_38;
  LifeTestSpec *local_28;
  LifeTestSpec *it;
  TestContext *testCtx;
  Types *types_local;
  TestCaseGroup *group_local;
  
  testCtx = (TestContext *)types;
  types_local = (Types *)group;
  it = (LifeTestSpec *)ContextWrapper::getTestContext(&types->super_ContextWrapper);
  for (local_28 = (LifeTestSpec *)s_lifeTests; this = types_local, testCtx_00 = it, spec = local_28,
      local_28 != (LifeTestSpec *)&SimpleBinder::vtable; local_28 = local_28 + 1) {
    types_00 = Types::getTypes((Types *)testCtx);
    createLifeTestGroup(&local_38,(TestContext *)testCtx_00,spec,types_00);
    pTVar2 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              release(&local_38)->super_TestNode;
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              (&local_38);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,(TestContext *)it,"delete_used","Delete current program");
  tcu::TestNode::addChild((TestNode *)types_local,pTVar2);
  this_00 = (LifeTest *)operator_new(0xc0);
  type = (Type *)(*(code *)testCtx->m_platform->_vptr_Platform)();
  LifeTest::LifeTest(this_00,"program","program",type,0x774e50);
  tcu::TestNode::addChild(pTVar2,(TestNode *)this_00);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,(TestContext *)it,"attach","Attachment tests");
  tcu::TestNode::addChild((TestNode *)types_local,pTVar2);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(TestContext *)it,"deleted_name","Name of deleted attachment");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  it_1._M_current = (Attacher **)Types::getAttachers((Types *)testCtx);
  local_80._M_current =
       (Attacher **)
       std::
       vector<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
       ::begin((vector<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
                *)it_1._M_current);
  while( true ) {
    name.field_2._8_8_ =
         std::
         vector<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
         ::end((vector<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
                *)it_1._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<deqp::gls::LifetimeTests::details::Attacher_*const_*,_std::vector<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>_>
                        *)((long)&name.field_2 + 8));
    if (!bVar1) break;
    ppAVar4 = __gnu_cxx::
              __normal_iterator<deqp::gls::LifetimeTests::details::Attacher_*const_*,_std::vector<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>_>
              ::operator*(&local_80);
    attacherName_abi_cxx11_((string *)local_a8,(details *)*ppAVar4,attacher);
    this_01 = (AttachmentTest *)operator_new(0xc0);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    pcVar9 = (char *)std::__cxx11::string::c_str();
    ppAVar4 = __gnu_cxx::
              __normal_iterator<deqp::gls::LifetimeTests::details::Attacher_*const_*,_std::vector<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>_>
              ::operator*(&local_80);
    AttachmentTest::AttachmentTest(this_01,pcVar8,pcVar9,*ppAVar4,0x775780);
    tcu::TestNode::addChild(pTVar3,(TestNode *)this_01);
    std::__cxx11::string::~string((string *)local_a8);
    __gnu_cxx::
    __normal_iterator<deqp::gls::LifetimeTests::details::Attacher_*const_*,_std::vector<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>_>
    ::operator++(&local_80);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(TestContext *)it,"deleted_input",
             "Input from deleted attachment");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  it_2._M_current = (InputAttacher **)Types::getInputAttachers((Types *)testCtx);
  local_d0._M_current =
       (InputAttacher **)
       std::
       vector<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
       ::begin((vector<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
                *)it_2._M_current);
  while( true ) {
    name_1.field_2._8_8_ =
         std::
         vector<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
         ::end((vector<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
                *)it_2._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_d0,
                       (__normal_iterator<deqp::gls::LifetimeTests::details::InputAttacher_*const_*,_std::vector<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>_>
                        *)((long)&name_1.field_2 + 8));
    if (!bVar1) break;
    ppIVar5 = __gnu_cxx::
              __normal_iterator<deqp::gls::LifetimeTests::details::InputAttacher_*const_*,_std::vector<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>_>
              ::operator*(&local_d0);
    pAVar7 = InputAttacher::getAttacher(*ppIVar5);
    attacherName_abi_cxx11_((string *)&outputGroup,(details *)pAVar7,attacher_00);
    this_02 = (InputAttachmentTest *)operator_new(0xb0);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    pcVar9 = (char *)std::__cxx11::string::c_str();
    ppIVar5 = __gnu_cxx::
              __normal_iterator<deqp::gls::LifetimeTests::details::InputAttacher_*const_*,_std::vector<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>_>
              ::operator*(&local_d0);
    InputAttachmentTest::InputAttachmentTest(this_02,pcVar8,pcVar9,*ppIVar5);
    tcu::TestNode::addChild(pTVar3,(TestNode *)this_02);
    std::__cxx11::string::~string((string *)&outputGroup);
    __gnu_cxx::
    __normal_iterator<deqp::gls::LifetimeTests::details::InputAttacher_*const_*,_std::vector<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>_>
    ::operator++(&local_d0);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(TestContext *)it,"deleted_output",
             "Output to deleted attachment");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  it_3._M_current = (OutputAttacher **)Types::getOutputAttachers((Types *)testCtx);
  local_110._M_current =
       (OutputAttacher **)
       std::
       vector<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>
       ::begin((vector<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>
                *)it_3._M_current);
  while( true ) {
    name_2.field_2._8_8_ =
         std::
         vector<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>
         ::end((vector<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>
                *)it_3._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_110,
                       (__normal_iterator<deqp::gls::LifetimeTests::details::OutputAttacher_*const_*,_std::vector<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>_>
                        *)((long)&name_2.field_2 + 8));
    if (!bVar1) break;
    ppOVar6 = __gnu_cxx::
              __normal_iterator<deqp::gls::LifetimeTests::details::OutputAttacher_*const_*,_std::vector<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>_>
              ::operator*(&local_110);
    pAVar7 = OutputAttacher::getAttacher(*ppOVar6);
    attacherName_abi_cxx11_((string *)local_138,(details *)pAVar7,attacher_01);
    this_03 = (OutputAttachmentTest *)operator_new(0xb0);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    pcVar9 = (char *)std::__cxx11::string::c_str();
    ppOVar6 = __gnu_cxx::
              __normal_iterator<deqp::gls::LifetimeTests::details::OutputAttacher_*const_*,_std::vector<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>_>
              ::operator*(&local_110);
    OutputAttachmentTest::OutputAttachmentTest(this_03,pcVar8,pcVar9,*ppOVar6);
    tcu::TestNode::addChild(pTVar3,(TestNode *)this_03);
    std::__cxx11::string::~string((string *)local_138);
    __gnu_cxx::
    __normal_iterator<deqp::gls::LifetimeTests::details::OutputAttacher_*const_*,_std::vector<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>_>
    ::operator++(&local_110);
  }
  return;
}

Assistant:

void addTestCases (TestCaseGroup& group, Types& types)
{
	TestContext& testCtx = types.getTestContext();

	for (const LifeTestSpec* it = DE_ARRAY_BEGIN(s_lifeTests);
		 it != DE_ARRAY_END(s_lifeTests); ++it)
		group.addChild(createLifeTestGroup(testCtx, *it, types.getTypes()).release());

	{
		TestCaseGroup* const delUsedGroup =
			new TestCaseGroup(testCtx, "delete_used", "Delete current program");
		group.addChild(delUsedGroup);

		delUsedGroup->addChild(
			new LifeTest("program", "program", types.getProgramType(),
						 &LifeTest::testDeleteUsed));
	}

	{
		TestCaseGroup* const	attGroup	= new TestCaseGroup(
			testCtx, "attach", "Attachment tests");
		group.addChild(attGroup);

		{
			TestCaseGroup* const	nameGroup	= new TestCaseGroup(
				testCtx, "deleted_name", "Name of deleted attachment");
			attGroup->addChild(nameGroup);

			const vector<Attacher*>& atts = types.getAttachers();
			for (vector<Attacher*>::const_iterator it = atts.begin(); it != atts.end(); ++it)
			{
				const string name = attacherName(**it);
				nameGroup->addChild(new AttachmentTest(name.c_str(), name.c_str(), **it,
													   &AttachmentTest::testDeletedNames));
			}
		}
		{
			TestCaseGroup* inputGroup = new TestCaseGroup(
				testCtx, "deleted_input", "Input from deleted attachment");
			attGroup->addChild(inputGroup);

			const vector<InputAttacher*>& inAtts = types.getInputAttachers();
			for (vector<InputAttacher*>::const_iterator it = inAtts.begin();
				 it != inAtts.end(); ++it)
			{
				const string name = attacherName((*it)->getAttacher());
				inputGroup->addChild(new InputAttachmentTest(name.c_str(), name.c_str(), **it));
			}
		}
		{
			TestCaseGroup* outputGroup = new TestCaseGroup(
				testCtx, "deleted_output", "Output to deleted attachment");
			attGroup->addChild(outputGroup);

			const vector<OutputAttacher*>& outAtts = types.getOutputAttachers();
			for (vector<OutputAttacher*>::const_iterator it = outAtts.begin();
				 it != outAtts.end(); ++it)
			{
				string name = attacherName((*it)->getAttacher());
				outputGroup->addChild(new OutputAttachmentTest(name.c_str(), name.c_str(),
															   **it));
			}
		}
	}
}